

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestStart(StreamingListener *this,TestInfo *test_info)

{
  char *pcVar1;
  String *this_00;
  String local_48;
  String local_38 [2];
  TestInfo *local_18;
  TestInfo *test_info_local;
  StreamingListener *this_local;
  
  local_18 = test_info;
  test_info_local = (TestInfo *)this;
  pcVar1 = TestInfo::name(test_info);
  this_00 = &local_48;
  String::Format(this_00,"event=TestStart&name=%s\n",pcVar1);
  String::operator_cast_to_string(local_38);
  Send(this,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  String::~String(this_00);
  return;
}

Assistant:

void OnTestStart(const TestInfo& test_info) {
    Send(String::Format("event=TestStart&name=%s\n", test_info.name()));
  }